

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O3

void __thiscall lsim::ModelWire::split_at_new_junction(ModelWire *this,Point *p)

{
  pointer puVar1;
  ModelWireSegment *segment;
  bool bVar2;
  ulong uVar3;
  ModelWireJunction *pMVar4;
  pointer puVar5;
  long lVar6;
  pointer puVar7;
  Point p_end;
  Point local_38;
  
  bVar2 = point_is_junction(this,p);
  if (bVar2) {
    return;
  }
  puVar5 = (this->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = *p;
  uVar3 = (long)puVar1 - (long)puVar5;
  if (0 < (long)uVar3 >> 5) {
    puVar7 = (pointer)((long)&(puVar5->_M_t).
                              super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                              .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl +
                      (uVar3 & 0xffffffffffffffe0));
    lVar6 = ((long)uVar3 >> 5) + 1;
    puVar5 = puVar5 + 2;
    do {
      bVar2 = ModelWireSegment::point_on_segment
                        (puVar5[-2]._M_t.
                         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                         &local_38);
      if (bVar2) {
        puVar5 = puVar5 + -2;
        goto LAB_00178e29;
      }
      bVar2 = ModelWireSegment::point_on_segment
                        (puVar5[-1]._M_t.
                         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                         &local_38);
      if (bVar2) {
        puVar5 = puVar5 + -1;
        goto LAB_00178e29;
      }
      bVar2 = ModelWireSegment::point_on_segment
                        ((puVar5->_M_t).
                         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                         &local_38);
      if (bVar2) goto LAB_00178e29;
      bVar2 = ModelWireSegment::point_on_segment
                        (puVar5[1]._M_t.
                         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                         &local_38);
      if (bVar2) {
        puVar5 = puVar5 + 1;
        goto LAB_00178e29;
      }
      lVar6 = lVar6 + -1;
      puVar5 = puVar5 + 4;
    } while (1 < lVar6);
    uVar3 = (long)puVar1 - (long)puVar7;
    puVar5 = puVar7;
  }
  lVar6 = (long)uVar3 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return;
      }
      bVar2 = ModelWireSegment::point_on_segment
                        ((puVar5->_M_t).
                         super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                         .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                         &local_38);
      if (bVar2) goto LAB_00178e29;
      puVar5 = puVar5 + 1;
    }
    bVar2 = ModelWireSegment::point_on_segment
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                       .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,
                       &local_38);
    if (bVar2) goto LAB_00178e29;
    puVar5 = puVar5 + 1;
  }
  bVar2 = ModelWireSegment::point_on_segment
                    ((puVar5->_M_t).
                     super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                     .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl,&local_38)
  ;
  if (!bVar2) {
    puVar5 = puVar1;
  }
LAB_00178e29:
  if (puVar5 != puVar1) {
    segment = (puVar5->_M_t).
              super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
              .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
    pMVar4 = *(ModelWireJunction **)((long)(segment->m_ends)._M_elems + 8);
    local_38 = pMVar4->m_position;
    ModelWireJunction::remove_segment(pMVar4,segment);
    pMVar4 = create_new_junction(this,p,segment);
    *(ModelWireJunction **)((long)(segment->m_ends)._M_elems + 8) = pMVar4;
    add_segment(this,p,&local_38);
  }
  return;
}

Assistant:

void ModelWire::split_at_new_junction(const Point &p) {
    // nothing to do if there is already a junction at the specified point
    if (point_is_junction(p)) {
        return;
    }

    // find segment containing the point
    auto found = std::find_if(m_segments.begin(), m_segments.end(), 
                                [p](const auto &s) {return s->point_on_segment(p);});
    if (found == m_segments.end()) {
        return;
    }
    auto segment = found->get();
	
	auto p_end = segment->junction(1)->position();
	segment->junction(1)->remove_segment(segment);
	segment->set_junction(1, create_new_junction(p, segment));
	add_segment(p, p_end);
}